

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

uint __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicEntryCount(cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar3 = LoadDynamicSection(this);
  uVar4 = 0;
  if (bVar3) {
    paVar1 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)paVar2 - (long)paVar1 >> 4;
    if (paVar2 != paVar1) {
      uVar5 = 0;
      do {
        if (paVar1[uVar5].d_tag == 0) {
          return (uint)uVar5;
        }
        uVar5 = (ulong)((uint)uVar5 + 1);
      } while (uVar5 < uVar6);
    }
    uVar4 = (uint)uVar6;
  }
  return uVar4;
}

Assistant:

unsigned int cmELFInternalImpl<Types>::GetDynamicEntryCount()
{
  if(!this->LoadDynamicSection())
    {
    return 0;
    }
  for(unsigned int i = 0; i < this->DynamicSectionEntries.size(); ++i)
    {
    if(this->DynamicSectionEntries[i].d_tag == DT_NULL)
      {
      return i;
      }
    }
  return static_cast<unsigned int>(this->DynamicSectionEntries.size());
}